

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O3

void Ivy_FraigCheckOutputSimsSavePattern(Ivy_FraigMan_t *p,Ivy_Obj_t *pObj)

{
  Ivy_Man_t *pIVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  void *pvVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  
  if (0 < (long)p->nSimWords) {
    lVar8 = 0;
    do {
      if (*(int *)((long)&pObj->pFanout->pFanout + lVar8 * 4) != 0) {
        uVar6 = 0;
        while ((*(uint *)((long)&pObj->pFanout->pFanout + lVar8 * 4) >> (uVar6 & 0x1f) & 1) == 0) {
          uVar6 = uVar6 + 1;
          if (uVar6 == 0x20) {
            __assert_fail("k < 32",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                          ,0x529,
                          "void Ivy_FraigCheckOutputSimsSavePattern(Ivy_FraigMan_t *, Ivy_Obj_t *)")
            ;
          }
        }
        pIVar1 = p->pManFraig;
        pvVar4 = malloc((long)pIVar1->nObjs[1] << 2);
        pVVar2 = p->pManAig->vPis;
        uVar5 = (ulong)pVVar2->nSize;
        if (0 < (long)uVar5) {
          ppvVar3 = pVVar2->pArray;
          uVar7 = 0;
          do {
            *(uint *)((long)pvVar4 + uVar7 * 4) =
                 (uint)((*(uint *)(*(long *)((long)ppvVar3[uVar7] + 0x20) + 0x20 + lVar8 * 4) >>
                         (uVar6 & 0x1f) & 1) != 0);
            uVar7 = uVar7 + 1;
          } while (uVar7 < uVar5);
        }
        if (pIVar1->pData == (void *)0x0) {
          pIVar1->pData = pvVar4;
          return;
        }
        __assert_fail("p->pManFraig->pData == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                      ,0x535,
                      "void Ivy_FraigCheckOutputSimsSavePattern(Ivy_FraigMan_t *, Ivy_Obj_t *)");
      }
      lVar8 = lVar8 + 1;
    } while (p->nSimWords != lVar8);
  }
  __assert_fail("i < p->nSimWords",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                ,0x524,"void Ivy_FraigCheckOutputSimsSavePattern(Ivy_FraigMan_t *, Ivy_Obj_t *)");
}

Assistant:

void Ivy_FraigCheckOutputSimsSavePattern( Ivy_FraigMan_t * p, Ivy_Obj_t * pObj )
{ 
    Ivy_FraigSim_t * pSims;
    int i, k, BestPat, * pModel;
    // find the word of the pattern
    pSims = Ivy_ObjSim(pObj);
    for ( i = 0; i < p->nSimWords; i++ )
        if ( pSims->pData[i] )
            break;
    assert( i < p->nSimWords );
    // find the bit of the pattern
    for ( k = 0; k < 32; k++ )
        if ( pSims->pData[i] & (1 << k) )
            break;
    assert( k < 32 );
    // determine the best pattern
    BestPat = i * 32 + k;
    // fill in the counter-example data
    pModel = ABC_ALLOC( int, Ivy_ManPiNum(p->pManFraig) );
    Ivy_ManForEachPi( p->pManAig, pObj, i )
    {
        pModel[i] = Ivy_InfoHasBit(Ivy_ObjSim(pObj)->pData, BestPat);
//        printf( "%d", pModel[i] );
    }
//    printf( "\n" );
    // set the model
    assert( p->pManFraig->pData == NULL );
    p->pManFraig->pData = pModel;
    return;
}